

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O3

int __thiscall kj::Url::clone(Url *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  code cVar1;
  code cVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  QueryParam *pQVar7;
  RemoveConst<kj::Url::QueryParam> *pRVar8;
  QueryParam *pQVar9;
  RemoveConst<kj::String> *pRVar10;
  String *pSVar11;
  Url *pUVar12;
  size_t sVar13;
  char *pcVar14;
  String *params;
  String *params_00;
  String *extraout_RDX;
  String *extraout_RDX_00;
  String *extraout_RDX_01;
  String *extraout_RDX_02;
  String *extraout_RDX_03;
  String *extraout_RDX_04;
  String *params_01;
  String *extraout_RDX_05;
  String *pSVar15;
  kj *pkVar16;
  kj *pkVar17;
  undefined1 local_198 [32];
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 local_178;
  String local_158;
  ArrayDisposer *local_140;
  Vector<kj::Url::QueryParam> local_138;
  Vector<kj::String> local_118;
  Url *local_f0;
  Array<kj::String> result;
  String local_c8;
  String local_a8;
  Maybe<kj::Url::UserInfo> local_88;
  undefined8 local_48;
  undefined8 uStack_40;
  ArrayDisposer *local_38;
  
  str<kj::String_const&>(&local_a8,(kj *)__fn,(String *)__child_stack);
  if (__fn[0x18] == (__fn)0x0) {
    local_88.ptr.isSet = false;
    pSVar15 = params;
  }
  else {
    str<kj::String_const&>((String *)local_198,(kj *)(__fn + 0x20),params);
    cVar1 = __fn[0x38];
    if (cVar1 == (code)0x1) {
      str<kj::String_const&>(&local_158,(kj *)(__fn + 0x40),params_00);
      local_178.value.content.ptr = local_158.content.ptr;
      local_178.value.content.size_ = local_158.content.size_;
      local_178.value.content.disposer = local_158.content.disposer;
    }
    local_198[0x18] = cVar1 == (code)0x1;
    Maybe<kj::Url::UserInfo>::Maybe(&local_88,(UserInfo *)local_198);
    uVar6 = local_178.value.content.size_;
    uVar5 = local_178.value.content.ptr;
    pSVar15 = extraout_RDX;
    if (((bool)local_198[0x18] == true) &&
       ((_func_int **)local_178.value.content.ptr != (_func_int **)0x0)) {
      local_178.value.content.ptr = (char *)0x0;
      local_178.value.content.size_ = 0;
      (**(local_178.value.content.disposer)->_vptr_ArrayDisposer)
                (local_178.value.content.disposer,uVar5,1,uVar6,uVar6,0);
      pSVar15 = extraout_RDX_00;
    }
    uVar6 = local_198._8_8_;
    uVar5 = local_198._0_8_;
    if ((char *)local_198._0_8_ != (char *)0x0) {
      local_198._0_8_ = (char *)0x0;
      local_198._8_8_ = (char *)0x0;
      (***(_func_int ***)local_198._16_8_)(local_198._16_8_,uVar5,1,uVar6,uVar6,0);
      pSVar15 = extraout_RDX_01;
    }
  }
  str<kj::String_const&>(&local_c8,(kj *)(__fn + 0x58),pSVar15);
  lVar3 = *(long *)(__fn + 0x78);
  lVar4 = *(long *)(__fn + 0x70);
  local_f0 = this;
  local_118.builder.ptr =
       (String *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (0x18,0,(lVar3 - lVar4 >> 3) * -0x5555555555555555,(_func_void_void_ptr *)0x0,
                  (_func_void_void_ptr *)0x0);
  local_198._16_8_ = (lVar3 - lVar4) + (long)local_118.builder.ptr;
  local_198._24_8_ = &kj::_::HeapArrayDisposer::instance;
  pkVar16 = *(kj **)(__fn + 0x70);
  local_118.builder.pos = local_118.builder.ptr;
  local_198._0_8_ = local_118.builder.ptr;
  if (pkVar16 != *(kj **)(__fn + 0x78)) {
    pSVar15 = extraout_RDX_02;
    do {
      local_198._8_8_ = local_118.builder.pos;
      str<kj::String_const&>(&local_158,pkVar16,pSVar15);
      ((local_118.builder.pos)->content).ptr = local_158.content.ptr;
      ((local_118.builder.pos)->content).size_ = local_158.content.size_;
      ((local_118.builder.pos)->content).disposer = local_158.content.disposer;
      local_118.builder.pos = local_118.builder.pos + 1;
      pkVar16 = pkVar16 + 0x18;
      pSVar15 = extraout_RDX_03;
    } while (pkVar16 != *(kj **)(__fn + 0x78));
  }
  result.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_118.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  result.ptr = (String *)0x0;
  result.size_ = 0;
  lVar3 = *(long *)(__fn + 0xa0);
  lVar4 = *(long *)(__fn + 0x98);
  cVar1 = __fn[0x90];
  local_198._8_8_ = local_118.builder.pos;
  local_118.builder.endPtr = local_118.builder.pos;
  local_138.builder.pos =
       (RemoveConst<kj::Url::QueryParam> *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (0x30,0,(lVar3 - lVar4 >> 4) * -0x5555555555555555,(_func_void_void_ptr *)0x0,
                  (_func_void_void_ptr *)0x0);
  local_158.content.disposer = (ArrayDisposer *)((lVar3 - lVar4) + (long)local_138.builder.pos);
  local_140 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pSVar15 = extraout_RDX_04;
  local_158.content.ptr = (char *)local_138.builder.pos;
  if (*(long *)(__fn + 0x98) != *(long *)(__fn + 0xa0)) {
    pkVar16 = (kj *)(*(long *)(__fn + 0x98) + 0x18);
    do {
      local_158.content.size_ = (size_t)local_138.builder.pos;
      str<kj::String_const&>((String *)local_198,pkVar16 + -0x18,pSVar15);
      if ((*(long *)(pkVar16 + 8) == 0) || (*(long *)pkVar16 == 0)) {
        local_198._24_8_ = (ArrayDisposer *)0x0;
        local_178.value.content.ptr = (char *)0x0;
        local_178.value.content.size_ = 0;
        pSVar15 = params_01;
      }
      else {
        str<kj::String_const&>((String *)(local_198 + 0x18),pkVar16,params_01);
        pSVar15 = extraout_RDX_05;
        local_138.builder.pos = (RemoveConst<kj::Url::QueryParam> *)local_158.content.size_;
      }
      ((local_138.builder.pos)->name).content.ptr = (char *)local_198._0_8_;
      ((local_138.builder.pos)->name).content.size_ = local_198._8_8_;
      local_198._0_8_ = (String *)0x0;
      local_198._8_8_ = (ArrayDisposer *)0x0;
      ((local_138.builder.pos)->name).content.disposer = (ArrayDisposer *)local_198._16_8_;
      ((local_138.builder.pos)->value).content.ptr = (char *)local_198._24_8_;
      ((local_138.builder.pos)->value).content.size_ = (size_t)local_178.value.content.ptr;
      ((local_138.builder.pos)->value).content.disposer =
           (ArrayDisposer *)local_178.value.content.size_;
      local_138.builder.pos = local_138.builder.pos + 1;
      pkVar17 = pkVar16 + 0x18;
      pkVar16 = pkVar16 + 0x30;
    } while (pkVar17 != *(kj **)(__fn + 0xa0));
  }
  local_48 = 0;
  uStack_40 = 0;
  cVar2 = __fn[0xb8];
  local_158.content.size_ = (size_t)local_138.builder.pos;
  local_138.builder.ptr = (QueryParam *)local_158.content.ptr;
  local_138.builder.endPtr = local_138.builder.pos;
  local_138.builder.disposer = local_140;
  local_38 = local_140;
  if (cVar2 == (code)0x1) {
    str<kj::String_const&>(&local_158,(kj *)(__fn + 0xc0),pSVar15);
    local_198._8_8_ = local_158.content.ptr;
    local_198._16_8_ = local_158.content.size_;
    local_198._24_8_ = local_158.content.disposer;
  }
  pUVar12 = local_f0;
  local_198[0] = cVar2 == (code)0x1;
  Url(local_f0,&local_a8,&local_88,&local_c8,&local_118,(bool)cVar1,&local_138,
      (Maybe<kj::String> *)local_198,SUB42(*(undefined4 *)(__fn + 0xd8),0));
  uVar6 = local_198._16_8_;
  uVar5 = local_198._8_8_;
  if (((bool)local_198[0] == true) && ((ArrayDisposer *)local_198._8_8_ != (ArrayDisposer *)0x0)) {
    local_198._8_8_ = (ArrayDisposer *)0x0;
    local_198._16_8_ = (ArrayDisposer *)0x0;
    (***(_func_int ***)local_198._24_8_)(local_198._24_8_,uVar5,1,uVar6,uVar6,0);
  }
  pQVar9 = local_138.builder.endPtr;
  pRVar8 = local_138.builder.pos;
  pQVar7 = local_138.builder.ptr;
  if (local_138.builder.ptr != (QueryParam *)0x0) {
    local_138.builder.ptr = (QueryParam *)0x0;
    local_138.builder.pos = (QueryParam *)0x0;
    local_138.builder.endPtr = (QueryParam *)0x0;
    (**(local_138.builder.disposer)->_vptr_ArrayDisposer)
              (local_138.builder.disposer,pQVar7,0x30,
               ((long)pRVar8 - (long)pQVar7 >> 4) * -0x5555555555555555,
               ((long)pQVar9 - (long)pQVar7 >> 4) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::Url::QueryParam>::destruct);
  }
  pSVar11 = local_118.builder.endPtr;
  pRVar10 = local_118.builder.pos;
  pSVar15 = local_118.builder.ptr;
  if (local_118.builder.ptr != (String *)0x0) {
    local_118.builder.ptr = (String *)0x0;
    local_118.builder.pos = (String *)0x0;
    local_118.builder.endPtr = (String *)0x0;
    (**(local_118.builder.disposer)->_vptr_ArrayDisposer)
              (local_118.builder.disposer,pSVar15,0x18,
               ((long)pRVar10 - (long)pSVar15 >> 3) * -0x5555555555555555,
               ((long)pSVar11 - (long)pSVar15 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  sVar13 = result.size_;
  pSVar15 = result.ptr;
  if (result.ptr != (String *)0x0) {
    result.ptr = (String *)0x0;
    result.size_ = 0;
    (**(result.disposer)->_vptr_ArrayDisposer)
              (result.disposer,pSVar15,0x18,sVar13,sVar13,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  sVar13 = local_c8.content.size_;
  pcVar14 = local_c8.content.ptr;
  if (local_c8.content.ptr != (char *)0x0) {
    local_c8.content.ptr = (char *)0x0;
    local_c8.content.size_ = 0;
    (**(local_c8.content.disposer)->_vptr_ArrayDisposer)
              (local_c8.content.disposer,pcVar14,1,sVar13,sVar13,0);
  }
  uVar6 = local_88.ptr.field_1._40_8_;
  uVar5 = local_88.ptr.field_1._32_8_;
  if (local_88.ptr.isSet == true) {
    if ((local_88.ptr.field_1.value.password.ptr.isSet == true) &&
       (local_88.ptr.field_1._32_8_ != 0)) {
      local_88.ptr.field_1._32_8_ = 0;
      local_88.ptr.field_1._40_8_ = 0;
      (*(code *)**(undefined8 **)local_88.ptr.field_1._48_8_)
                (local_88.ptr.field_1._48_8_,uVar5,1,uVar6,uVar6,0);
    }
    uVar6 = local_88.ptr.field_1.value.username.content.size_;
    uVar5 = local_88.ptr.field_1.value.username.content.ptr;
    if (local_88.ptr.field_1.value.username.content.ptr != (char *)0x0) {
      local_88.ptr.field_1.value.username.content.ptr = (char *)0x0;
      local_88.ptr.field_1.value.username.content.size_ = 0;
      (**(local_88.ptr.field_1.value.username.content.disposer)->_vptr_ArrayDisposer)
                (local_88.ptr.field_1.value.username.content.disposer,uVar5,1,uVar6,uVar6,0);
    }
  }
  sVar13 = local_a8.content.size_;
  pcVar14 = local_a8.content.ptr;
  if (local_a8.content.ptr != (char *)0x0) {
    local_a8.content.ptr = (char *)0x0;
    local_a8.content.size_ = 0;
    (**(local_a8.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.content.disposer,pcVar14,1,sVar13,sVar13,0);
  }
  return (int)pUVar12;
}

Assistant:

Url Url::clone() const {
  return {
    kj::str(scheme),
    userInfo.map([](const UserInfo& ui) -> UserInfo {
      return {
        kj::str(ui.username),
        ui.password.map([](const String& s) { return kj::str(s); })
      };
    }),
    kj::str(host),
    KJ_MAP(part, path) { return kj::str(part); },
    hasTrailingSlash,
    KJ_MAP(param, query) -> QueryParam {
      // Preserve the "allocated-ness" of `param.value` with this careful copy.
      return { kj::str(param.name), param.value.begin() == nullptr ? kj::String()
                                                                   : kj::str(param.value) };
    },
    fragment.map([](const String& s) { return kj::str(s); }),
    options
  };
}